

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

bool __thiscall
EthBasePort::WriteBlockNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *wdata,uint nbytes,uchar flags)

{
  uchar *puVar1;
  byte flags_00;
  quadlet_t *pqVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint extraout_EDX;
  undefined6 in_register_00000032;
  undefined7 in_register_00000089;
  ulong uVar7;
  uchar *puVar8;
  allocator<char> local_6d;
  uint local_6c;
  uint local_68;
  undefined4 local_64;
  quadlet_t *local_60;
  nodeaddr_t local_58;
  string local_50 [32];
  
  local_64 = (undefined4)CONCAT71(in_register_00000089,flags);
  local_60 = wdata;
  if ((int)CONCAT62(in_register_00000032,node) != 0x3f) {
    std::__cxx11::string::string<std::allocator<char>>(local_50,"WriteBlock",&local_6d);
    iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_50,0);
    std::__cxx11::string::~string(local_50);
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  local_58 = addr;
  BasePort::SetGenericBuffer(&this->super_BasePort);
  puVar8 = (this->super_BasePort).GenericBuffer;
  local_6c = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
  iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,2);
  local_68 = nbytes;
  iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x15])(this);
  uVar7 = (ulong)(iVar4 + iVar3 + nbytes);
  uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
  pqVar2 = local_60;
  uVar6 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,2);
  puVar1 = (this->super_BasePort).WriteBufferBroadcast;
  if ((uchar *)((long)pqVar2 + (-(ulong)uVar6 - (ulong)uVar5)) == puVar1) {
    uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
    puVar8 = puVar1 + uVar5;
  }
  else {
    puVar8 = puVar8 + local_6c;
  }
  this->fw_tl = this->fw_tl + 1 & 0x3f;
  flags_00 = (byte)local_64;
  (*(this->super_BasePort)._vptr_BasePort[0x31])(this,puVar8,uVar7,node,(ulong)(byte)local_64);
  make_write_header(this,puVar8,extraout_EDX,flags_00);
  uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  make_bwrite_packet(this,(quadlet_t *)(puVar8 + uVar5),node,local_58,local_60,local_68,
                     (uint)this->fw_tl);
  iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                    (this,node,puVar8,uVar7,(ulong)(flags_00 >> 7));
  return (bool)(char)iVar3;
}

Assistant:

bool EthBasePort::WriteBlockNode(nodeid_t node, nodeaddr_t addr, quadlet_t *wdata,
                                 unsigned int nbytes, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("WriteBlock"))
        return false;

    // Packet to send
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *packet = GenericBuffer+GetWriteQuadAlign();
    size_t packetSize = GetPrefixOffset(WR_FW_BDATA) + nbytes + GetWritePostfixSize();

    // Check for real-time write
    unsigned char *wdata_base = reinterpret_cast<unsigned char *>(wdata)-GetWriteQuadAlign()-GetPrefixOffset(WR_FW_BDATA);
    if (wdata_base == WriteBufferBroadcast) {
        packet = WriteBufferBroadcast+GetWriteQuadAlign();
    }

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(packet, packetSize, node, flags);

    // Make control word
    make_write_header(packet, packetSize, flags);

    // Build FireWire packet
    make_bwrite_packet(reinterpret_cast<quadlet_t *>(packet+GetPrefixOffset(WR_FW_HEADER)), node, addr, wdata, nbytes, fw_tl);

    // Now, send the packet
    return PacketSend(node, packet, packetSize, flags&FW_NODE_ETH_BROADCAST_MASK);
}